

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::SortSitesByDistance
          (S2Builder *this,S2Point *x,compact_array<int,_std::allocator<int>_> *sites)

{
  uint uVar1;
  int *__i;
  int *__last;
  long lVar2;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *__first;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_02;
  
  if ((sites->super_compact_array_base<int,_std::allocator<int>_>).is_inlined_ == false) {
    __first = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              (sites->super_compact_array_base<int,_std::allocator<int>_>).field_7.pointer_;
  }
  else {
    __first = &(sites->super_compact_array_base<int,_std::allocator<int>_>).field_7;
  }
  uVar1 = *(uint *)&sites->super_compact_array_base<int,_std::allocator<int>_> & 0xffffff;
  if (uVar1 != 0) {
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    __comp_02._M_comp.this = this;
    __comp_02._M_comp.x = x;
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
              ((int *)__first->more_inlined_elements_,
               (int *)(__first->more_inlined_elements_ + uVar1 * 4),
               (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp_02);
    if (uVar1 < 0x11) {
      __comp_01._M_comp.this = this;
      __comp_01._M_comp.x = x;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
                ((int *)__first->more_inlined_elements_,
                 (int *)(__first->more_inlined_elements_ + uVar1 * 4),__comp_01);
      return;
    }
    __last = (int *)(__first + 8);
    __comp_00._M_comp.this = this;
    __comp_00._M_comp.x = x;
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
              ((int *)__first->more_inlined_elements_,__last,__comp_00);
    lVar2 = (ulong)(uVar1 * 4) - 0x40;
    do {
      __comp._M_comp.this = this;
      __comp._M_comp.x = x;
      std::
      __unguarded_linear_insert<int*,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
                (__last,__comp);
      __last = __last + 1;
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void S2Builder::SortSitesByDistance(const S2Point& x,
                                    compact_array<SiteId>* sites) const {
  // Sort sites in increasing order of distance to X.
  std::sort(sites->begin(), sites->end(),
            [&x, this](SiteId i, SiteId j) {
      return s2pred::CompareDistances(x, sites_[i], sites_[j]) < 0;
    });
}